

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Abs_ManSupport2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    if ((pObj->field_0x7 & 0x40) != 0) break;
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 != 0) break;
    iVar1 = Gia_ObjRefNum(p,pObj);
    if (0 < iVar1) break;
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                    ,0x1f6,"void Abs_ManSupport2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Abs_ManSupport2_rec(p,pObj + -(ulong)uVar2,vSupp);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  iVar1 = Gia_ObjId(p,pObj);
  Vec_IntPush(vSupp,iVar1);
  return;
}

Assistant:

void Abs_ManSupport2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark1 || Gia_ObjIsRo(p, pObj) || Gia_ObjRefNum(p, pObj) > 0 )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Abs_ManSupport2_rec( p, Gia_ObjFanin0(pObj), vSupp );
    Abs_ManSupport2_rec( p, Gia_ObjFanin1(pObj), vSupp );
}